

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O2

Error asmjit::X86Logging_formatImmBits(StringBuilder *sb,uint32_t u8,ImmBits *bits,uint32_t count)

{
  char cVar1;
  uint32_t i;
  uint uVar2;
  Error EVar3;
  ulong uVar4;
  char *__s;
  int iVar5;
  char buf [64];
  
  uVar4 = 0;
  iVar5 = 0;
  do {
    if (uVar4 == count) {
      if (iVar5 == 0) {
        EVar3 = 0;
      }
      else {
        EVar3 = StringBuilder::_opChar(sb,1,'>');
      }
      return EVar3;
    }
    if (bits[uVar4].mode == '\x01') {
      __s = buf;
      snprintf(__s,0x40,bits[uVar4].text);
    }
    else {
      if (bits[uVar4].mode != '\0') {
        return 4;
      }
      __s = bits[uVar4].text;
      for (uVar2 = 0; uVar2 != (bits[uVar4].mask & u8) >> (bits[uVar4].shift & 0x1f);
          uVar2 = uVar2 + 1) {
        do {
          cVar1 = *__s;
          __s = __s + 1;
        } while (cVar1 != '\0');
      }
    }
    if (*__s != '\0') {
      EVar3 = StringBuilder::_opChar(sb,1,(iVar5 != 0) << 6 | 0x3c);
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = StringBuilder::_opString(sb,1,__s,0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      iVar5 = iVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmBits(StringBuilder& sb, uint32_t u8, const ImmBits* bits, uint32_t count) noexcept {
  uint32_t n = 0;
  char buf[64];

  for (uint32_t i = 0; i < count; i++) {
    const ImmBits& spec = bits[i];

    uint32_t value = (u8 & static_cast<uint32_t>(spec.mask)) >> spec.shift;
    const char* str = nullptr;

    switch (spec.mode) {
      case ImmBits::kModeLookup:
        str = Utils::findPackedString(spec.text, value);
        break;

      case ImmBits::kModeFormat:
        snprintf(buf, sizeof(buf), spec.text, static_cast<unsigned int>(value));
        str = buf;
        break;

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (!str[0])
      continue;

    ASMJIT_PROPAGATE(sb.appendChar(++n == 1 ? '<' : '|'));
    ASMJIT_PROPAGATE(sb.appendString(str));
  }

  return n ? sb.appendChar('>') : static_cast<Error>(kErrorOk);
}